

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_macros.cpp
# Opt level: O0

MacroFormalArgumentSyntax * __thiscall
slang::parsing::Preprocessor::MacroParser::parseFormalArgument(MacroParser *this)

{
  bool bVar1;
  MacroFormalArgumentSyntax *pMVar2;
  undefined8 in_RDI;
  Token TVar3;
  Token TVar4;
  TokenKind in_stack_0000000e;
  MacroParser *in_stack_00000010;
  Token equals;
  MacroArgumentDefaultSyntax *argDef;
  Token arg;
  bool in_stack_000001ef;
  MacroParser *in_stack_000001f0;
  MacroParser *in_stack_ffffffffffffff90;
  TokenKind kind;
  span<slang::parsing::Token,_18446744073709551615UL> in_stack_ffffffffffffffa0;
  BumpAllocator *in_stack_ffffffffffffffb0;
  span<slang::parsing::Token,_18446744073709551615UL> *local_28;
  
  kind = (TokenKind)((ulong)in_RDI >> 0x30);
  TVar3 = peek(in_stack_ffffffffffffff90);
  if ((TVar3.kind == Identifier) || (bVar1 = LexerFacts::isKeyword(TVar3.kind), bVar1)) {
    TVar4 = consume((MacroParser *)in_stack_ffffffffffffffa0._M_ptr);
    local_28 = (span<slang::parsing::Token,_18446744073709551615UL> *)TVar4.info;
  }
  else {
    TVar3 = expect(in_stack_00000010,in_stack_0000000e);
  }
  bVar1 = peek((MacroParser *)in_stack_ffffffffffffffa0._M_ptr,kind);
  if (bVar1) {
    TVar4 = consume((MacroParser *)in_stack_ffffffffffffffa0._M_ptr);
    in_stack_ffffffffffffffb0 = TVar4._0_8_;
    in_stack_ffffffffffffffa0 = parseTokenList(in_stack_000001f0,in_stack_000001ef);
    BumpAllocator::
    emplace<slang::syntax::MacroArgumentDefaultSyntax,slang::parsing::Token&,std::span<slang::parsing::Token,18446744073709551615ul>>
              ((BumpAllocator *)TVar3.info,TVar3._0_8_,local_28);
  }
  pMVar2 = BumpAllocator::
           emplace<slang::syntax::MacroFormalArgumentSyntax,slang::parsing::Token&,slang::syntax::MacroArgumentDefaultSyntax*&>
                     (in_stack_ffffffffffffffb0,
                      (Token *)in_stack_ffffffffffffffa0._M_extent._M_extent_value._M_extent_value,
                      (MacroArgumentDefaultSyntax **)in_stack_ffffffffffffffa0._M_ptr);
  return pMVar2;
}

Assistant:

MacroFormalArgumentSyntax* Preprocessor::MacroParser::parseFormalArgument() {
    Token arg = peek();
    if (arg.kind == TokenKind::Identifier || LF::isKeyword(arg.kind))
        consume();
    else
        arg = expect(TokenKind::Identifier);

    MacroArgumentDefaultSyntax* argDef = nullptr;
    if (peek(TokenKind::Equals)) {
        auto equals = consume();
        argDef = pp.alloc.emplace<MacroArgumentDefaultSyntax>(equals, parseTokenList(false));
    }

    return pp.alloc.emplace<MacroFormalArgumentSyntax>(arg, argDef);
}